

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O1

shared_ptr<ASTNode> __thiscall SchemeObject::to_AST(SchemeObject *this)

{
  runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  long *in_RSI;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  undefined1 local_40 [32];
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  (**(code **)(*in_RSI + 0x10))(local_40);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x15a714);
  local_60 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_60 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  *(undefined ***)this_00 = &PTR__runtime_error_0017a350;
  __cxa_throw(this_00,&eval_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<ASTNode> SchemeObject::to_AST() const
{
    throw eval_error("Cannot evaluate " + external_repr());
}